

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

LOs __thiscall Omega_h::get_degrees(Omega_h *this,LOs *offsets,string *name)

{
  Alloc *pAVar1;
  ulong uVar2;
  void *extraout_RDX;
  size_t sVar3;
  uint uVar4;
  LOs LVar5;
  Write<int> degrees;
  type f;
  Write<int> local_a0;
  Write<int> local_90;
  Write<int> local_80;
  Write<int> local_70;
  Write<int> local_60;
  Write<int> local_50;
  Write<int> local_40;
  Write<int> local_30;
  
  pAVar1 = (offsets->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  Write<int>::Write(&local_a0,(int)(sVar3 >> 2) + -1,name);
  Write<int>::Write(&local_80,&local_a0);
  Write<int>::Write(&local_70,&offsets->write_);
  if (((ulong)local_a0.shared_alloc_.alloc & 1) == 0) {
    uVar2 = (local_a0.shared_alloc_.alloc)->size;
  }
  else {
    uVar2 = (ulong)local_a0.shared_alloc_.alloc >> 3;
  }
  Write<int>::Write(&local_60,&local_80);
  Write<int>::Write(&local_50,&local_70);
  uVar4 = (uint)(uVar2 >> 2);
  if (0 < (int)uVar4) {
    entering_parallel = 1;
    Write<int>::Write(&local_40,&local_60);
    Write<int>::Write(&local_30,&local_50);
    entering_parallel = 0;
    for (uVar2 = 0; (uVar4 & 0x7fffffff) != uVar2; uVar2 = uVar2 + 1) {
      *(int *)((long)local_40.shared_alloc_.direct_ptr + uVar2 * 4) =
           *(int *)((long)local_30.shared_alloc_.direct_ptr + uVar2 * 4 + 4) -
           *(int *)((long)local_30.shared_alloc_.direct_ptr + uVar2 * 4);
    }
    get_degrees(Omega_h::Read<int>,std::__cxx11::string_const&)::$_0::~__0((__0 *)&local_40);
  }
  get_degrees(Omega_h::Read<int>,std::__cxx11::string_const&)::$_0::~__0((__0 *)&local_60);
  Write<int>::Write(&local_90,&local_a0);
  Read<int>::Read((Read<signed_char> *)this,&local_90);
  Write<int>::~Write(&local_90);
  get_degrees(Omega_h::Read<int>,std::__cxx11::string_const&)::$_0::~__0((__0 *)&local_80);
  Write<int>::~Write(&local_a0);
  LVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar5.write_.shared_alloc_;
}

Assistant:

LOs get_degrees(LOs offsets, std::string const& name) {
  Write<LO> degrees(offsets.size() - 1, name);
  auto f = OMEGA_H_LAMBDA(LO i) { degrees[i] = offsets[i + 1] - offsets[i]; };
  parallel_for(degrees.size(), f, "get_degrees");
  return degrees;
}